

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall SwitchStatement::Action(SwitchStatement *this)

{
  SymbolName SVar1;
  SymbolType local_24;
  SymbolName name;
  SymbolType expression_type;
  int state;
  int ret;
  SwitchStatement *this_local;
  
  expression_type = INT;
  name = WHILE_SYM;
  _state = this;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(name) {
    case WHILE_SYM:
      if (SVar1 != SWITCH_SYM) {
        return -1;
      }
      name = SWITCH_SYM;
      break;
    case SWITCH_SYM:
      if (SVar1 != L_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      name = IF_SYM;
      break;
    case IF_SYM:
      expression_type = Expression::Action(&this->m_expression,&local_24);
      if (expression_type != INT) {
        return -1;
      }
      Expression::LogOutput(&this->m_expression);
      name = CASE_SYM;
      break;
    case CASE_SYM:
      if (SVar1 != R_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      name = DEFAULT_SYM;
      break;
    case DEFAULT_SYM:
      if (SVar1 != L_CURLY_BRACKET_SYM) {
        return -1;
      }
      name = RETURN_SYM;
      break;
    case RETURN_SYM:
      expression_type = SwitchTable::Action(&this->m_switch_table,&local_24);
      if (expression_type != INT) {
        return -1;
      }
      SwitchTable::LogOutput(&this->m_switch_table);
      name = PRINTF_SYM;
      break;
    case PRINTF_SYM:
      expression_type = Default::Action(&this->m_default);
      if (expression_type == INT) {
        Default::LogOutput(&this->m_default);
        name = SCANF_SYM;
      }
      else {
        if (SVar1 != R_CURLY_BRACKET_SYM) {
          return -1;
        }
        name = INT_SYM;
      }
      break;
    case SCANF_SYM:
      if (SVar1 != R_CURLY_BRACKET_SYM) {
        return -1;
      }
      name = INT_SYM;
      break;
    case INT_SYM:
      return 0;
    }
    if (((name != CASE_SYM) && (name != PRINTF_SYM)) && (name != SCANF_SYM)) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
  } while( true );
}

Assistant:

compile_errcode SwitchStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == SWITCH_SYM) {
                    state = 1;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 2: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    m_expression.LogOutput();
                    state = 3;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 4: {
                if (name == L_CURLY_BRACKET_SYM) {
                    state = 5;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 5: {
                if ((ret = m_switch_table.Action(expression_type)) == COMPILE_OK) {
                    m_switch_table.LogOutput();
                    state = 6;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 6: {
                if ((ret = m_default.Action()) == COMPILE_OK) {
                    m_default.LogOutput();
                    state = 7;
                    break;
                } else if (name == R_CURLY_BRACKET_SYM) {
                    state = 8;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 7: {
                if (name == R_CURLY_BRACKET_SYM) {
                    state = 8;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 8: return COMPILE_OK;
        }
        if (state != 3 && state != 6 && state != 7)
            handle_correct_queue->NextSymbol();
    }
    ERROR_SWITCH:
       return NOT_MATCH;
}